

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O1

bool __thiscall ON_HatchLine::operator!=(ON_HatchLine *this,ON_HatchLine *src)

{
  bool bVar1;
  double *pdVar2;
  double *pdVar3;
  bool bVar4;
  
  bVar4 = true;
  if ((this->m_angle_radians == src->m_angle_radians) &&
     (!NAN(this->m_angle_radians) && !NAN(src->m_angle_radians))) {
    bVar1 = ON_2dPoint::operator!=(&this->m_base,&src->m_base);
    if (!bVar1) {
      bVar1 = ON_2dVector::operator!=(&this->m_offset,&src->m_offset);
      if (!bVar1) {
        pdVar2 = (double *)0x0;
        pdVar3 = (double *)0x0;
        if (0 < (this->m_dashes).m_count) {
          pdVar3 = (this->m_dashes).m_a;
        }
        if (0 < (src->m_dashes).m_count) {
          pdVar2 = (src->m_dashes).m_a;
        }
        bVar4 = pdVar3 != pdVar2;
      }
    }
  }
  return bVar4;
}

Assistant:

bool ON_HatchLine::operator!=(const ON_HatchLine& src) const
{
  return(
    m_angle_radians != src.m_angle_radians
    || m_base != src.m_base
    || m_offset != src.m_offset
    || m_dashes != src.m_dashes
    );
}